

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sub_32_re_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint value;
  
  uVar4 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  uVar4 = (int)(short)uVar1 + uVar4;
  uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar3 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar4);
  }
  uVar2 = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
  value = uVar2 - uVar1;
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.x_flag = ((value | uVar1) & ~uVar2 | value & uVar1) >> 0x17;
  m68ki_cpu.v_flag = ((uVar2 ^ value) & (uVar1 ^ uVar2)) >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_32(uVar4 & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static void m68k_op_sub_32_re_di(void)
{
	uint ea = EA_AY_DI_32();
	uint src = DX;
	uint dst = m68ki_read_32(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_32(res);
	FLAG_Z = MASK_OUT_ABOVE_32(res);
	FLAG_X = FLAG_C = CFLAG_SUB_32(src, dst, res);
	FLAG_V = VFLAG_SUB_32(src, dst, res);

	m68ki_write_32(ea, FLAG_Z);
}